

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_VRR_Algorithm_Base.cpp
# Opt level: O2

StringSet * __thiscall
OSTEI_VRR_Algorithm_Base::GetVarReq_abi_cxx11_
          (StringSet *__return_storage_ptr__,OSTEI_VRR_Algorithm_Base *this,QAM *am)

{
  RRStepType rrstep;
  undefined1 auStack_88 [48];
  undefined1 local_58 [48];
  
  QAM::QAM((QAM *)local_58,am);
  rrstep = GetRRStep(this,(QAM *)local_58);
  std::__cxx11::string::~string((string *)(local_58 + 0x10));
  QAM::QAM((QAM *)auStack_88,am);
  GenerateVarReq_abi_cxx11_
            (__return_storage_ptr__,(OSTEI_VRR_Algorithm_Base *)am,(QAM *)auStack_88,rrstep);
  std::__cxx11::string::~string((string *)(auStack_88 + 0x10));
  return __return_storage_ptr__;
}

Assistant:

StringSet OSTEI_VRR_Algorithm_Base::GetVarReq(QAM am) const
{
    RRStepType rrstep = GetRRStep(am);
    return GenerateVarReq(am, rrstep);
}